

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.h
# Opt level: O0

ImageStructureHeader lrit::getHeader<lrit::ImageStructureHeader>(Buffer *b,HeaderMap *m)

{
  bool bVar1;
  runtime_error *this;
  ImageStructureHeader IVar2;
  const_iterator it;
  int *in_stack_00000100;
  char (*in_stack_00000108) [2];
  char (*in_stack_00000110) [89];
  char (*in_stack_00000118) [37];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffffac;
  Buffer *in_stack_ffffffffffffffb0;
  _Self local_30;
  _Self local_28 [5];
  
  local_28[0]._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                 (in_stack_ffffffffffffff68,(key_type *)0x16abe5);
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                 (in_stack_ffffffffffffff68);
  bVar1 = std::operator!=(local_28,&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)0x16acdd);
    IVar2 = getHeader<lrit::ImageStructureHeader>
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    return IVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  util::str<char[37],char[89],char[2],int>
            (in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000100);
  std::runtime_error::runtime_error(this,(string *)&stack0xffffffffffffffb0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

H getHeader(const Buffer& b, const HeaderMap& m) {
  auto it = m.find(H::CODE);
  ASSERT(it != m.end());
  return getHeader<H>(b, it->second);
}